

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O2

bool obj_or_objects(Am_Value *v)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value lv;
  Am_Value_List l;
  Am_Value local_38;
  Am_Value_List local_28;
  
  bVar1 = Am_Value::Valid(v);
  if (bVar1) {
    if (v->type == 0xa001) {
      return true;
    }
    bVar1 = Am_Value_List::Test(v);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_28,v);
      local_38.type = 0;
      local_38.value.wrapper_value = (Am_Wrapper *)0x0;
      Am_Value_List::Start(&local_28);
      while (bVar1 = Am_Value_List::Last(&local_28), !bVar1) {
        in_value = Am_Value_List::Get(&local_28);
        Am_Value::operator=(&local_38,in_value);
        if (local_38.type != 0xa001) break;
        Am_Value_List::Next(&local_28);
      }
      Am_Value::~Am_Value(&local_38);
      Am_Value_List::~Am_Value_List(&local_28);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
obj_or_objects(Am_Value &v)
{
  if (!v.Valid())
    return false;
  if (v.type == Am_OBJECT)
    return true;
  else if (Am_Value_List::Test(v)) {
    Am_Value_List l = v;
    Am_Value lv;
    for (l.Start(); !l.Last(); l.Next()) {
      lv = l.Get();
      if (lv.type != Am_OBJECT)
        return false;
    }
    return true;
  } else
    return false;
}